

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

char * loadfile(char *fn,int *size,bool utf8)

{
  int iVar1;
  stream *psVar2;
  ulong uVar3;
  int local_44;
  int rlen;
  int offset;
  char *buf;
  int len;
  stream *f;
  bool utf8_local;
  int *size_local;
  char *fn_local;
  
  psVar2 = openfile(fn,"rb");
  if (psVar2 == (stream *)0x0) {
    fn_local = (char *)0x0;
  }
  else {
    buf._4_4_ = (*psVar2->_vptr_stream[7])();
    if (buf._4_4_ < 1) {
      if (psVar2 != (stream *)0x0) {
        (*psVar2->_vptr_stream[1])();
      }
      fn_local = (char *)0x0;
    }
    else {
      uVar3 = (ulong)(buf._4_4_ + 1);
      if ((long)uVar3 < 0) {
        uVar3 = 0xffffffffffffffff;
      }
      fn_local = (char *)operator_new__(uVar3);
      if ((uchar *)fn_local == (uchar *)0x0) {
        if (psVar2 != (stream *)0x0) {
          (*psVar2->_vptr_stream[1])();
        }
        fn_local = (char *)0x0;
      }
      else {
        local_44 = 0;
        if ((utf8) && (2 < buf._4_4_)) {
          iVar1 = (*psVar2->_vptr_stream[9])(psVar2,fn_local,3);
          if (iVar1 != 3) {
            if (psVar2 != (stream *)0x0) {
              (*psVar2->_vptr_stream[1])();
            }
            if ((uchar *)fn_local != (uchar *)0x0) {
              operator_delete__(fn_local);
            }
            return (char *)0x0;
          }
          if (((*fn_local == 0xef) && (((uchar *)fn_local)[1] == 0xbb)) &&
             (((uchar *)fn_local)[2] == 0xbf)) {
            buf._4_4_ = buf._4_4_ + -3;
          }
          else {
            local_44 = 3;
          }
        }
        iVar1 = (*psVar2->_vptr_stream[9])
                          (psVar2,(uchar *)fn_local + local_44,(ulong)(uint)(buf._4_4_ - local_44));
        if (psVar2 != (stream *)0x0) {
          (*psVar2->_vptr_stream[1])();
        }
        if (iVar1 == buf._4_4_ - local_44) {
          if (utf8) {
            buf._4_4_ = decodeutf8((uchar *)fn_local,buf._4_4_,(uchar *)fn_local,buf._4_4_,
                                   (int *)0x0);
          }
          ((uchar *)fn_local)[buf._4_4_] = '\0';
          if (size != (int *)0x0) {
            *size = buf._4_4_;
          }
        }
        else {
          if ((uchar *)fn_local != (uchar *)0x0) {
            operator_delete__(fn_local);
          }
          fn_local = (char *)0x0;
        }
      }
    }
  }
  return fn_local;
}

Assistant:

char *loadfile(const char *fn, int *size, bool utf8)
{
    stream *f = openfile(fn, "rb");
    if(!f) return NULL;
    int len = (int)f->size();
    if(len <= 0) { delete f; return NULL; }
    char *buf = new char[len+1];
    if(!buf) { delete f; return NULL; }
    int offset = 0;
    if(utf8 && len >= 3)
    {
        if(f->read(buf, 3) != 3) { delete f; delete[] buf; return NULL; }
        if(((uchar *)buf)[0] == 0xEF && ((uchar *)buf)[1] == 0xBB && ((uchar *)buf)[2] == 0xBF) len -= 3;
        else offset += 3;
    }
    int rlen = f->read(&buf[offset], len-offset);
    delete f;
    if(rlen != len-offset) { delete[] buf; return NULL; }
    if(utf8) len = decodeutf8((uchar *)buf, len, (uchar *)buf, len);
    buf[len] = '\0';
    if(size!=NULL) *size = len;
    return buf;
}